

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

int __thiscall
CVmObjLookupTable::getp_nthKey(CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int32_t iVar2;
  vm_obj_id_t self_00;
  undefined4 in_register_00000034;
  
  self_00 = (vm_obj_id_t)argc;
  if (getp_nthKey(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_nthKey(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_nthKey::desc.min_argc_ = 1;
      getp_nthKey::desc.opt_argc_ = 0;
      getp_nthKey::desc.varargs_ = 0;
      __cxa_guard_release(&getp_nthKey(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_nthKey::desc);
  if (iVar1 == 0) {
    iVar2 = CVmBif::pop_long_val();
    get_nth_ele(this,retval,(vm_val_t *)0x0,self_00,(long)iVar2);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_nthKey(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the nth key value */
    get_nth_ele(vmg_ retval, 0, self, CVmBif::pop_long_val(vmg0_));

    /* handled */
    return TRUE;
}